

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.hpp
# Opt level: O2

basic_string_view<char,_std::char_traits<char>_> __thiscall
nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::substr
          (basic_string_view<char,_std::char_traits<char>_> *this,size_type pos,size_type n)

{
  ulong uVar1;
  out_of_range *this_00;
  ulong in_RCX;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  allocator local_49;
  out_of_range local_48 [16];
  string local_38 [32];
  
  uVar1 = *(ulong *)(pos + 8) - n;
  if (n <= *(ulong *)(pos + 8)) {
    bVar2.size_ = (const_pointer)(n + *(long *)pos);
    if (uVar1 < in_RCX) {
      in_RCX = uVar1;
    }
    this->data_ = bVar2.size_;
    this->size_ = in_RCX;
    bVar2.data_ = (const_pointer)this;
    return bVar2;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string(local_38,"nonstd::string_view::substr()",&local_49);
  std::out_of_range::out_of_range(local_48,local_38);
  std::out_of_range::out_of_range(this_00,local_48);
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

nssv_constexpr size_type size()     const nssv_noexcept { return size_; }